

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaB_assert(lua_State *L)

{
  int iVar1;
  TValue *pTVar2;
  char *pcVar3;
  TValue *pTVar4;
  
  luaL_checkany(L,1);
  pTVar2 = L->base;
  pTVar4 = &luaO_nilobject_;
  if (pTVar2 < L->top) {
    pTVar4 = pTVar2;
  }
  iVar1 = pTVar4->tt;
  if (iVar1 == 1) {
    iVar1 = (pTVar4->value).b;
  }
  if (iVar1 == 0) {
    pcVar3 = luaL_optlstring(L,2,"assertion failed!",(size_t *)0x0);
    luaL_error(L,"%s",pcVar3);
  }
  return (int)((ulong)((long)L->top - (long)pTVar2) >> 4);
}

Assistant:

static int luaB_assert(lua_State*L){
luaL_checkany(L,1);
if(!lua_toboolean(L,1))
return luaL_error(L,"%s",luaL_optstring(L,2,"assertion failed!"));
return lua_gettop(L);
}